

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHie.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkFlattenLogicHierarchy(Abc_Ntk_t *pNtk)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Abc_Obj_t *pAVar6;
  char *pcVar7;
  Abc_Ntk_t *p;
  Vec_Str_t *pVVar8;
  Abc_Des_t *pAVar9;
  uint local_40;
  int local_3c;
  int Counter;
  int i;
  Abc_Obj_t *pNet;
  Abc_Obj_t *pTerm;
  Abc_Ntk_t *pNtkNew;
  Vec_Str_t *vPref;
  Abc_Ntk_t *pNtk_local;
  
  local_40 = 0xffffffff;
  vPref = (Vec_Str_t *)pNtk;
  iVar3 = Abc_NtkIsNetlist(pNtk);
  if (iVar3 == 0) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                  ,0x20a,"Abc_Ntk_t *Abc_NtkFlattenLogicHierarchy(Abc_Ntk_t *)");
  }
  pTerm = (Abc_Obj_t *)Abc_NtkAlloc(vPref->nCap,vPref->nSize,1);
  pAVar6 = (Abc_Obj_t *)Extra_UtilStrsav(vPref->pArray);
  pTerm->pNext = pAVar6;
  pcVar7 = Extra_UtilStrsav(*(char **)(vPref + 1));
  *(char **)&pTerm->Id = pcVar7;
  Abc_NtkCleanCopy((Abc_Ntk_t *)vPref);
  for (local_3c = 0; iVar3 = local_3c, iVar4 = Abc_NtkPiNum((Abc_Ntk_t *)vPref), iVar3 < iVar4;
      local_3c = local_3c + 1) {
    pNet = Abc_NtkPi((Abc_Ntk_t *)vPref,local_3c);
    Abc_NtkDupObj((Abc_Ntk_t *)pTerm,pNet,0);
    _Counter = Abc_ObjFanout0(pNet);
    pAVar6 = pTerm;
    pcVar7 = Abc_ObjName(_Counter);
    pAVar6 = Abc_NtkFindOrCreateNet((Abc_Ntk_t *)pAVar6,pcVar7);
    (_Counter->field_6).pCopy = pAVar6;
    Abc_ObjAddFanin((_Counter->field_6).pCopy,(pNet->field_6).pCopy);
  }
  for (local_3c = 0; iVar3 = local_3c, iVar4 = Abc_NtkPoNum((Abc_Ntk_t *)vPref), iVar3 < iVar4;
      local_3c = local_3c + 1) {
    pNet = Abc_NtkPo((Abc_Ntk_t *)vPref,local_3c);
    Abc_NtkDupObj((Abc_Ntk_t *)pTerm,pNet,0);
    _Counter = Abc_ObjFanin0(pNet);
    pAVar6 = pTerm;
    pcVar7 = Abc_ObjName(_Counter);
    pAVar6 = Abc_NtkFindOrCreateNet((Abc_Ntk_t *)pAVar6,pcVar7);
    (_Counter->field_6).pCopy = pAVar6;
    Abc_ObjAddFanin((pNet->field_6).pCopy,(_Counter->field_6).pCopy);
  }
  p = (Abc_Ntk_t *)Vec_StrAlloc(1000);
  pNtkNew = p;
  pcVar7 = Abc_NtkName((Abc_Ntk_t *)vPref);
  Vec_StrPrintStr((Vec_Str_t *)p,pcVar7);
  Abc_NtkFlattenLogicHierarchy_rec
            ((Abc_Ntk_t *)pTerm,(Abc_Ntk_t *)vPref,(int *)&local_40,(Vec_Str_t *)pNtkNew);
  uVar2 = local_40;
  uVar5 = Abc_NtkBlackboxNum((Abc_Ntk_t *)pTerm);
  printf("Hierarchy reader flattened %d instances of logic boxes and left %d black boxes.\n",
         (ulong)uVar2,(ulong)uVar5);
  Vec_StrFree((Vec_Str_t *)pNtkNew);
  lVar1._0_4_ = vPref[0xb].nCap;
  lVar1._4_4_ = vPref[0xb].nSize;
  if (lVar1 != 0) {
    pVVar8 = (Vec_Str_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(*(long *)(vPref + 0xb) + 0x10),0);
    if (pVVar8 != vPref) {
      __assert_fail("Vec_PtrEntry(pNtk->pDesign->vTops, 0) == pNtk",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                    ,0x231,"Abc_Ntk_t *Abc_NtkFlattenLogicHierarchy(Abc_Ntk_t *)");
    }
    pAVar9 = Abc_DesDupBlackboxes(*(Abc_Des_t **)(vPref + 0xb),(Abc_Ntk_t *)pTerm);
    pTerm[2].vFanins.pArray = (int *)pAVar9;
    for (local_3c = 0; iVar3 = local_3c, iVar4 = Vec_PtrSize((Vec_Ptr_t *)pTerm[1].pNext),
        iVar3 < iVar4; local_3c = local_3c + 1) {
      pNet = Abc_NtkBox((Abc_Ntk_t *)pTerm,local_3c);
      iVar3 = Abc_ObjIsBlackbox(pNet);
      if (iVar3 != 0) {
        pNet->field_5 =
             *(anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *)((long)(pNet->field_5).pData + 0x160);
      }
    }
  }
  Abc_NtkOrderCisCos((Abc_Ntk_t *)pTerm);
  if (vPref[0x14].pArray != (char *)0x0) {
    printf("EXDC is not transformed.\n");
  }
  iVar3 = Abc_NtkCheck((Abc_Ntk_t *)pTerm);
  if (iVar3 == 0) {
    fprintf(_stdout,"Abc_NtkFlattenLogicHierarchy(): Network check has failed.\n");
    Abc_NtkDelete((Abc_Ntk_t *)pTerm);
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    pNtk_local = (Abc_Ntk_t *)pTerm;
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkFlattenLogicHierarchy( Abc_Ntk_t * pNtk )
{
    extern Abc_Des_t * Abc_DesDupBlackboxes( Abc_Des_t * p, Abc_Ntk_t * pNtkSave );
    Vec_Str_t * vPref;
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pTerm, * pNet;
    int i, Counter = -1;

    assert( Abc_NtkIsNetlist(pNtk) );
//    Abc_NtkPrintBoxInfo( pNtk );

    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);

    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );

    // duplicate PIs/POs and their nets
    Abc_NtkForEachPi( pNtk, pTerm, i )
    {
        Abc_NtkDupObj( pNtkNew, pTerm, 0 );
        pNet = Abc_ObjFanout0( pTerm );
        pNet->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pNet) );
        Abc_ObjAddFanin( pNet->pCopy, pTerm->pCopy );
    }
    Abc_NtkForEachPo( pNtk, pTerm, i )
    {
        Abc_NtkDupObj( pNtkNew, pTerm, 0 );
        pNet = Abc_ObjFanin0( pTerm );
        pNet->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pNet) );
        Abc_ObjAddFanin( pTerm->pCopy, pNet->pCopy );
    }

    // recursively flatten hierarchy, create internal logic, add new PI/PO names if there are black boxes
    vPref = Vec_StrAlloc( 1000 );
    Vec_StrPrintStr( vPref, Abc_NtkName(pNtk) );
    Abc_NtkFlattenLogicHierarchy_rec( pNtkNew, pNtk, &Counter, vPref );
    printf( "Hierarchy reader flattened %d instances of logic boxes and left %d black boxes.\n", 
        Counter, Abc_NtkBlackboxNum(pNtkNew) );
    Vec_StrFree( vPref );

    if ( pNtk->pDesign )
    {
        // pass on the design
        assert( Vec_PtrEntry(pNtk->pDesign->vTops, 0) == pNtk );
        pNtkNew->pDesign = Abc_DesDupBlackboxes( pNtk->pDesign, pNtkNew );
        // update the pointers
        Abc_NtkForEachBlackbox( pNtkNew, pTerm, i )
            pTerm->pData = ((Abc_Ntk_t *)pTerm->pData)->pCopy;
    }

    // we may have added property outputs
    Abc_NtkOrderCisCos( pNtkNew );

    // copy the timing information
//    Abc_ManTimeDup( pNtk, pNtkNew );
    // duplicate EXDC 
    if ( pNtk->pExdc )
        printf( "EXDC is not transformed.\n" );
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        fprintf( stdout, "Abc_NtkFlattenLogicHierarchy(): Network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}